

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_io.c
# Opt level: O3

int io_file_read(lua_State *L,IOFileUD *iof,int start)

{
  byte bVar1;
  TValue *pTVar2;
  TValue *pTVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  char *pcVar8;
  size_t sVar9;
  GCstr *pGVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  bool bVar14;
  TValue local_38;
  
  pTVar2 = L->top;
  pTVar3 = L->base;
  clearerr((FILE *)iof);
  iVar13 = (int)((ulong)((long)pTVar2 - (long)pTVar3) >> 3) - start;
  if (iVar13 == 0) {
    uVar4 = io_file_readline(L,(FILE *)iof,1);
    uVar12 = (ulong)(start + 1);
  }
  else {
    luaL_checkstack(L,iVar13 + 0x14,"too many arguments");
    uVar12 = (ulong)start;
    uVar4 = 1;
    do {
      uVar11 = *(uint *)((long)L->base + uVar12 * 8 + 4);
      if (uVar11 == 0xfffffffb) {
        uVar7 = (ulong)L->base[uVar12].u32.lo;
        bVar1 = *(byte *)(uVar7 + 0x10 + (ulong)(*(char *)(uVar7 + 0x10) == '*'));
        if (bVar1 == 0x6e) {
          iVar5 = __isoc99_fscanf(iof,"%lf",&local_38);
          if (iVar5 == 1) {
            pTVar2 = L->top;
            L->top = pTVar2 + 1;
            *pTVar2 = local_38;
            uVar4 = 1;
          }
          else {
            pTVar2 = L->top;
            L->top = pTVar2 + 1;
            (pTVar2->field_2).it = 0xffffffff;
            uVar4 = 0;
          }
        }
        else if ((bVar1 & 0xdf) == 0x4c) {
          uVar4 = io_file_readline(L,(FILE *)iof,(uint)(bVar1 == 0x6c));
        }
        else {
          if (bVar1 != 0x61) {
            lj_err_arg(L,(int)uVar12 + 1,LJ_ERR_INVFMT);
          }
          uVar7 = 0;
          uVar11 = 0x2000;
          do {
            pcVar8 = lj_buf_tmp(L,uVar11);
            sVar9 = fread(pcVar8 + uVar7,1,(ulong)(uVar11 - (int)uVar7),(FILE *)iof);
            uVar6 = (int)sVar9 + (int)uVar7;
            uVar7 = (ulong)uVar11;
            bVar14 = uVar6 == uVar11;
            uVar11 = uVar11 * 2;
          } while (bVar14);
          pTVar2 = L->top;
          L->top = pTVar2 + 1;
          pGVar10 = lj_str_new(L,pcVar8,(ulong)uVar6);
          (pTVar2->u32).lo = (uint32_t)pGVar10;
          (pTVar2->field_2).it = 0xfffffffb;
          uVar7 = (ulong)(L->glref).ptr32;
          if (*(uint *)(uVar7 + 0x54) <= *(uint *)(uVar7 + 0x50)) {
            lj_gc_step(L);
          }
        }
      }
      else {
        iVar5 = (int)uVar12 + 1;
        if (0xfffeffff < uVar11) {
          lj_err_arg(L,iVar5,LJ_ERR_INVOPT);
        }
        uVar4 = lj_lib_checkint(L,iVar5);
        if (uVar4 == 0) {
          iVar5 = getc((FILE *)iof);
          ungetc(iVar5,(FILE *)iof);
          pTVar2 = L->top;
          L->top = pTVar2 + 1;
          (pTVar2->u32).lo = (L->glref).ptr32 + 0xf8;
          (pTVar2->field_2).it = 0xfffffffb;
          bVar14 = iVar5 != -1;
        }
        else {
          pcVar8 = lj_buf_tmp(L,uVar4);
          sVar9 = fread(pcVar8,1,(ulong)uVar4,(FILE *)iof);
          pTVar2 = L->top;
          L->top = pTVar2 + 1;
          pGVar10 = lj_str_new(L,pcVar8,sVar9 & 0xffffffff);
          (pTVar2->u32).lo = (uint32_t)pGVar10;
          (pTVar2->field_2).it = 0xfffffffb;
          uVar7 = (ulong)(L->glref).ptr32;
          if (*(uint *)(uVar7 + 0x54) <= *(uint *)(uVar7 + 0x50)) {
            lj_gc_step(L);
          }
          bVar14 = (sVar9 & 0xffffffff) != 0;
        }
        uVar4 = (uint)bVar14;
      }
      iVar13 = iVar13 + -1;
      uVar12 = uVar12 + 1;
    } while ((iVar13 != 0) && (uVar4 != 0));
  }
  iVar13 = ferror((FILE *)iof);
  if (iVar13 == 0) {
    if (uVar4 == 0) {
      *(undefined4 *)((long)L->top + -4) = 0xffffffff;
    }
    iVar13 = (int)uVar12 - start;
  }
  else {
    iVar13 = luaL_fileresult(L,0,(char *)0x0);
  }
  return iVar13;
}

Assistant:

static int io_file_read(lua_State *L, IOFileUD *iof, int start)
{
  FILE *fp = iof->fp;
  int ok, n, nargs = (int)(L->top - L->base) - start;
  clearerr(fp);
  if (nargs == 0) {
    ok = io_file_readline(L, fp, 1);
    n = start+1;  /* Return 1 result. */
  } else {
    /* The results plus the buffers go on top of the args. */
    luaL_checkstack(L, nargs+LUA_MINSTACK, "too many arguments");
    ok = 1;
    for (n = start; nargs-- && ok; n++) {
      if (tvisstr(L->base+n)) {
	const char *p = strVdata(L->base+n);
	if (p[0] == '*') p++;
	if (p[0] == 'n')
	  ok = io_file_readnum(L, fp);
	else if ((p[0] & ~0x20) == 'L')
	  ok = io_file_readline(L, fp, (p[0] == 'l'));
	else if (p[0] == 'a')
	  io_file_readall(L, fp);
	else
	  lj_err_arg(L, n+1, LJ_ERR_INVFMT);
      } else if (tvisnumber(L->base+n)) {
	ok = io_file_readlen(L, fp, (MSize)lj_lib_checkint(L, n+1));
      } else {
	lj_err_arg(L, n+1, LJ_ERR_INVOPT);
      }
    }
  }
  if (ferror(fp))
    return luaL_fileresult(L, 0, NULL);
  if (!ok)
    setnilV(L->top-1);  /* Replace last result with nil. */
  return n - start;
}